

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ClientConductor.cpp
# Opt level: O0

int64_t __thiscall
aeron::ClientConductor::addSubscription
          (ClientConductor *this,string *channel,int32_t streamId,
          on_available_image_t *onAvailableImageHandler,
          on_unavailable_image_t *onUnavailableImageHandler)

{
  int *piVar1;
  long *__args_4;
  longlong *in_RDI;
  ClientConductor *in_stack_00000020;
  int64_t registrationId;
  lock_guard<std::recursive_mutex> lock;
  mutex_type *in_stack_ffffffffffffff78;
  function<long_long_()> *in_stack_ffffffffffffff80;
  string *in_stack_ffffffffffffffa8;
  int *__args_2;
  DriverProxy *in_stack_ffffffffffffffb0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffb8;
  vector<aeron::ClientConductor::SubscriptionStateDefn,_std::allocator<aeron::ClientConductor::SubscriptionStateDefn>_>
  *in_stack_ffffffffffffffc0;
  function<void_(aeron::Image_&)> *in_stack_ffffffffffffffd0;
  
  verifyDriverIsActive(in_stack_00000020);
  ensureOpen(in_stack_00000020);
  std::lock_guard<std::recursive_mutex>::lock_guard
            ((lock_guard<std::recursive_mutex> *)in_stack_ffffffffffffff80,in_stack_ffffffffffffff78
            );
  piVar1 = (int *)DriverProxy::addSubscription
                            (in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8,
                             (int32_t)((ulong)in_RDI >> 0x20));
  __args_2 = piVar1;
  __args_4 = (long *)std::function<long_long_()>::operator()(in_stack_ffffffffffffff80);
  std::
  vector<aeron::ClientConductor::SubscriptionStateDefn,std::allocator<aeron::ClientConductor::SubscriptionStateDefn>>
  ::
  emplace_back<std::__cxx11::string_const&,long&,int&,long_long,std::function<void(aeron::Image&)>const&,std::function<void(aeron::Image&)>const&>
            (in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,__args_4,__args_2,in_RDI,
             (function<void_(aeron::Image_&)> *)__args_4,in_stack_ffffffffffffffd0);
  std::lock_guard<std::recursive_mutex>::~lock_guard((lock_guard<std::recursive_mutex> *)0x1f4018);
  return (int64_t)piVar1;
}

Assistant:

std::int64_t ClientConductor::addSubscription(
    const std::string &channel,
    std::int32_t streamId,
    const on_available_image_t &onAvailableImageHandler,
    const on_unavailable_image_t &onUnavailableImageHandler)
{
    verifyDriverIsActive();
    ensureOpen();

    std::lock_guard<std::recursive_mutex> lock(m_adminLock);

    std::int64_t registrationId = m_driverProxy.addSubscription(channel, streamId);

    m_subscriptions.emplace_back(
        channel, registrationId, streamId, m_epochClock(), onAvailableImageHandler, onUnavailableImageHandler);

    return registrationId;
}